

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2
          (LASreadItemCompressed_GPSTIME11_v2 *this,ArithmeticDecoder *dec)

{
  ArithmeticModel *pAVar1;
  IntegerCompressor *this_00;
  I32 *local_58;
  I32 *local_48;
  U64I64F64 *local_30;
  ArithmeticDecoder *dec_local;
  LASreadItemCompressed_GPSTIME11_v2 *this_local;
  
  LASreadItemCompressed::LASreadItemCompressed(&this->super_LASreadItemCompressed);
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b0130;
  this->last_gpstime[0].u64 = 0;
  local_30 = this->last_gpstime + 1;
  do {
    local_30->u64 = 0;
    local_30 = local_30 + 1;
  } while (local_30 != (U64I64F64 *)this->last_gpstime_diff);
  this->last_gpstime_diff[0] = 0;
  local_48 = this->last_gpstime_diff + 1;
  do {
    *local_48 = 0;
    local_48 = local_48 + 1;
  } while (local_48 != this->multi_extreme_counter);
  this->multi_extreme_counter[0] = 0;
  local_58 = this->multi_extreme_counter + 1;
  do {
    *local_58 = 0;
    local_58 = local_58 + 1;
  } while ((ArithmeticModel **)local_58 != &this->m_gpstime_multi);
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x204);
    this->m_gpstime_multi = pAVar1;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,6);
    this->m_gpstime_0diff = pAVar1;
    this_00 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(this_00,dec,0x20,9,8,0);
    this->ic_gpstime = this_00;
    this->last = 0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v2.cpp"
                ,0x100,
                "LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2(ArithmeticDecoder* dec)
{
  /* set decoder */
  assert(dec);
  this->dec = dec;
  /* create entropy models and integer compressors */
  m_gpstime_multi = dec->createSymbolModel(LASZIP_GPSTIME_MULTI_TOTAL);
  m_gpstime_0diff = dec->createSymbolModel(6);
  ic_gpstime = new IntegerCompressor(dec, 32, 9); // 32 bits, 9 contexts
  last = 0;
}